

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O0

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  float *pfVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_1;
  float *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int channels_2;
  int h_2;
  float *ptr_4;
  int size_2;
  Mat *bottom_blob_9;
  size_t b_9;
  float *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int channels_1;
  int w_3;
  float *outptr_3;
  float *ptr_3;
  int size_1;
  int channels;
  Mat *bottom_blob_7;
  size_t b_7;
  int q;
  Mat *top_blob_3;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int h_1;
  int w_2;
  float *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  float *outptr_2;
  int i;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int h;
  float *ptr_1;
  int size;
  Mat *bottom_blob_3;
  size_t b_3;
  float *outptr_1;
  Mat *top_blob_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int w_1;
  float *ptr;
  int w;
  Mat *bottom_blob_1;
  size_t b_1;
  float *outptr;
  Mat *top_blob;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  int iVar5;
  Mat *in_stack_fffffffffffffc50;
  ulong uVar6;
  undefined8 in_stack_fffffffffffffc58;
  Mat *this_00;
  Mat *in_stack_fffffffffffffc60;
  Mat local_308;
  Mat *local_2d8;
  const_reference local_2d0;
  ulong local_2c8;
  int local_2bc;
  Mat local_2b8;
  float *local_288;
  int local_27c;
  reference local_278;
  const_reference local_270;
  ulong local_268;
  int local_25c;
  int local_258;
  int local_254;
  Mat local_250;
  float *local_220;
  int local_214;
  const_reference local_210;
  ulong local_208;
  Mat local_200;
  float *local_1d0;
  int local_1c4;
  reference local_1c0;
  const_reference local_1b8;
  ulong local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  Mat local_190;
  float *local_160;
  float *local_158;
  int local_150;
  int local_14c;
  const_reference local_148;
  ulong local_140;
  int local_134;
  reference local_130;
  const_reference local_128;
  ulong local_120;
  int local_114;
  int local_110;
  int local_10c;
  float *local_108;
  const_reference local_100;
  ulong local_f8;
  float *local_f0;
  int local_e4;
  reference local_e0;
  const_reference local_d8;
  ulong local_d0;
  int local_c8;
  int local_c4;
  float *local_c0;
  int local_b4;
  const_reference local_b0;
  ulong local_a8;
  float *local_a0;
  reference local_98;
  const_reference local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  float *local_78;
  int local_6c;
  const_reference local_68;
  ulong local_60;
  float *local_58;
  reference local_50;
  const_reference local_48;
  ulong local_40;
  int local_34;
  size_t local_30;
  int local_24;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_24 = pvVar2->dims;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_30 = pvVar2->elemsize;
  if (local_24 == 1) {
    local_34 = 0;
    local_40 = 0;
    while( true ) {
      uVar6 = local_40;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar5 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
      if (sVar3 <= uVar6) break;
      local_48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_40);
      local_34 = local_48->w + local_34;
      local_40 = local_40 + 1;
    }
    local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc50,iVar5,(size_t)in_stack_fffffffffffffc40);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_58 = Mat::operator_cast_to_float_(local_50);
      local_60 = 0;
      while( true ) {
        uVar6 = local_60;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar6) break;
        local_68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_60)
        ;
        local_6c = local_68->w;
        local_78 = Mat::operator_cast_to_float_(local_68);
        memcpy(local_58,local_78,(long)local_6c * local_30);
        local_58 = local_58 + local_6c;
        local_60 = local_60 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_7c = pvVar2->w;
    local_80 = 0;
    local_88 = 0;
    while( true ) {
      uVar6 = local_88;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar3 <= uVar6) break;
      local_90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_88);
      local_80 = local_90->h + local_80;
      local_88 = local_88 + 1;
    }
    local_98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                (int)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_a0 = Mat::operator_cast_to_float_(local_98);
      local_a8 = 0;
      while( true ) {
        uVar6 = local_a8;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar6) break;
        local_b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_a8)
        ;
        local_b4 = local_7c * local_b0->h;
        local_c0 = Mat::operator_cast_to_float_(local_b0);
        memcpy(local_a0,local_c0,(long)local_b4 * local_30);
        local_a0 = local_a0 + local_b4;
        local_a8 = local_a8 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_c4 = pvVar2->h;
    local_c8 = 0;
    local_d0 = 0;
    while( true ) {
      uVar6 = local_d0;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar3 <= uVar6) break;
      local_d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_d0);
      local_c8 = local_d8->w + local_c8;
      local_d0 = local_d0 + 1;
    }
    local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                (int)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_e4 = 0; local_e4 < local_c4; local_e4 = local_e4 + 1) {
        local_f0 = Mat::row(local_e0,local_e4);
        local_f8 = 0;
        while( true ) {
          uVar6 = local_f8;
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar3 <= uVar6) break;
          local_100 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_f8);
          local_108 = Mat::row(local_100,local_e4);
          memcpy(local_f0,local_108,(long)local_100->w * local_30);
          local_f0 = local_f0 + local_100->w;
          local_f8 = local_f8 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_10c = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_110 = pvVar2->h;
    local_114 = 0;
    local_120 = 0;
    while( true ) {
      uVar6 = local_120;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar5 = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
      if (sVar3 <= uVar6) break;
      local_128 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_120)
      ;
      local_114 = local_128->c + local_114;
      local_120 = local_120 + 1;
    }
    local_130 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                (int)in_stack_fffffffffffffc58,iVar5,(size_t)in_stack_fffffffffffffc48);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_134 = 0;
      local_140 = 0;
      while( true ) {
        uVar6 = local_140;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar6) break;
        local_148 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_140);
        local_14c = local_148->c;
        local_150 = (int)local_148->cstep * local_14c;
        local_158 = Mat::operator_cast_to_float_(local_148);
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_190);
        Mat::~Mat((Mat *)0x110adc);
        local_160 = pfVar4;
        memcpy(pfVar4,local_158,(long)local_150 * local_30);
        local_134 = local_14c + local_134;
        local_140 = local_140 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1a0 = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1a4 = pvVar2->c;
    local_1a8 = 0;
    local_1b0 = 0;
    while( true ) {
      uVar6 = local_1b0;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar5 = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
      if (sVar3 <= uVar6) break;
      local_1b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_1b0)
      ;
      local_1a8 = local_1b8->h + local_1a8;
      local_1b0 = local_1b0 + 1;
    }
    local_1c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                (int)in_stack_fffffffffffffc58,iVar5,(size_t)in_stack_fffffffffffffc48);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_1c4 = 0; local_1c4 < local_1a4; local_1c4 = local_1c4 + 1) {
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_200);
        Mat::~Mat((Mat *)0x110d1a);
        local_208 = 0;
        local_1d0 = pfVar4;
        while( true ) {
          uVar6 = local_208;
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar3 <= uVar6) break;
          local_210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_208);
          local_214 = local_210->w * local_210->h;
          Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pfVar4 = Mat::operator_cast_to_float_(&local_250);
          Mat::~Mat((Mat *)0x110dd2);
          local_220 = pfVar4;
          memcpy(local_1d0,pfVar4,(long)local_214 * local_30);
          local_1d0 = local_1d0 + local_214;
          local_208 = local_208 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 2)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_254 = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_258 = pvVar2->c;
    local_25c = 0;
    local_268 = 0;
    while( true ) {
      uVar6 = local_268;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar5 = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
      if (sVar3 <= uVar6) break;
      local_270 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_268)
      ;
      local_25c = local_270->w + local_25c;
      local_268 = local_268 + 1;
    }
    local_278 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                (int)in_stack_fffffffffffffc58,iVar5,(size_t)in_stack_fffffffffffffc48);
    bVar1 = Mat::empty(in_stack_fffffffffffffc40);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_27c = 0; local_27c < local_258; local_27c = local_27c + 1) {
        this_00 = &local_2b8;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x11105a);
        local_288 = pfVar4;
        for (local_2bc = 0; local_2bc < local_254; local_2bc = local_2bc + 1) {
          local_2c8 = 0;
          while( true ) {
            uVar6 = local_2c8;
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
            if (sVar3 <= uVar6) break;
            local_2d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  (local_18,local_2c8);
            in_stack_fffffffffffffc40 = &local_308;
            Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
            in_stack_fffffffffffffc48 = (Mat *)Mat::row(in_stack_fffffffffffffc40,local_2bc);
            Mat::~Mat((Mat *)0x111120);
            local_2d8 = in_stack_fffffffffffffc48;
            memcpy(local_288,in_stack_fffffffffffffc48,(long)local_2d0->w * local_30);
            local_288 = local_288 + local_2d0->w;
            local_2c8 = local_2c8 + 1;
          }
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}